

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.cpp
# Opt level: O3

int iascii_int32(p_ply ply,double *value)

{
  int iVar1;
  uint uVar2;
  char *in_RAX;
  long lVar3;
  char *end;
  char *local_18;
  
  local_18 = in_RAX;
  iVar1 = ply_read_word(ply);
  if (iVar1 == 0) {
    uVar2 = 0;
  }
  else {
    lVar3 = strtol(ply->buffer + ply->buffer_token,&local_18,10);
    *value = (double)lVar3;
    uVar2 = (uint)((int)lVar3 == lVar3 && *local_18 == '\0');
  }
  return uVar2;
}

Assistant:

static int iascii_int32(p_ply ply, double *value) {
    char *end;
    if (!ply_read_word(ply)) return 0;
    *value = strtol(BWORD(ply), &end, 10);
    if (*end || *value > PLY_INT32_MAX || *value < PLY_INT32_MIN) return 0;
    return 1;
}